

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O3

String * Rct::backtrace(String *__return_storage_ptr__,int maxFrames)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  void *__ptr;
  char *pcVar4;
  char *pcVar5;
  void *__ptr_00;
  char *__s;
  void *pvVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  int status;
  char buf [1024];
  char frame [1024];
  void *stack [1024];
  int local_2844;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2840;
  undefined1 local_2838 [1024];
  char local_2438 [1024];
  undefined1 local_2038 [8200];
  
  iVar3 = ::backtrace(local_2038,0x400);
  if (iVar3 < 1) {
    String::String(__return_storage_ptr__,"Couldn\'t get stack trace",0xffffffffffffffff);
  }
  else {
    paVar1 = &(__return_storage_ptr__->mString).field_2;
    (__return_storage_ptr__->mString)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->mString)._M_string_length = 0;
    (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
    __ptr = (void *)backtrace_symbols(local_2038,iVar3);
    if (__ptr != (void *)0x0) {
      local_2840 = paVar1;
      if (maxFrames != 0 && iVar3 != 1) {
        uVar9 = iVar3 - 2U;
        if (maxFrames - 1U < iVar3 - 2U) {
          uVar9 = maxFrames - 1U;
        }
        uVar7 = 1;
        do {
          pcVar5 = *(char **)((long)__ptr + uVar7 * 8);
          if (pcVar5 == (char *)0x0) {
LAB_0015fd7a:
            bVar2 = true;
            __ptr_00 = (void *)0x0;
            pvVar6 = *(void **)((long)__ptr + uVar7 * 8);
          }
          else {
            pcVar4 = strchr(pcVar5,0x28);
            __s = pcVar4 + 1;
            if (pcVar4 == (char *)0x0) {
              __s = pcVar5;
            }
            pcVar5 = strchr(__s,0x2b);
            if (pcVar5 == (char *)0x0) {
              sVar8 = strlen(__s);
            }
            else {
              sVar8 = (long)pcVar5 - (long)__s;
            }
            if (0x3ff < sVar8) goto LAB_0015fd7a;
            memcpy(local_2838,__s,sVar8 + 1);
            local_2838[sVar8] = 0;
            __ptr_00 = (void *)__cxa_demangle(local_2838,0,0,&local_2844);
            if (local_2844 != 0) {
              if (__ptr_00 != (void *)0x0) {
                free(__ptr_00);
              }
              goto LAB_0015fd7a;
            }
            if (__ptr_00 == (void *)0x0) goto LAB_0015fd7a;
            bVar2 = false;
            pvVar6 = __ptr_00;
          }
          snprintf(local_2438,0x400,"%d/%d %s\n",uVar7 & 0xffffffff,(ulong)(iVar3 - 1),pvVar6);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if (!bVar2) {
            free(__ptr_00);
          }
          uVar7 = uVar7 + 1;
        } while (uVar9 + 2 != uVar7);
      }
      free(__ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String backtrace(int maxFrames)
{
    enum { SIZE = 1024 };
    void *stack[SIZE];

    const int frameCount = backtrace(stack, sizeof(stack) / sizeof(void*));
    if (frameCount <= 0)
        return String("Couldn't get stack trace");
    String ret;
    char **symbols = backtrace_symbols(stack, frameCount);
    if (symbols) {
        char frame[1024];
        for (int i=1; i<frameCount && (maxFrames < 0 || i - 1 < maxFrames); ++i) {
            char *demangled = demangle(symbols[i]);
            snprintf(frame, sizeof(frame), "%d/%d %s\n", i, frameCount - 1, demangled ? demangled : symbols[i]);
            ret += frame;
            if (demangled)
                free(demangled);
        }
        free(symbols);
    }
    return ret;
}